

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O1

void __thiscall
charls_jpegls_encoder::write_spiff_entry
          (charls_jpegls_encoder *this,uint32_t entry_tag,void *entry_data,
          size_t entry_data_size_bytes)

{
  if (entry_data_size_bytes == 0 || entry_data != (void *)0x0) {
    if (entry_tag == 1) goto LAB_00105e32;
    if (entry_data_size_bytes < 0xfff9) {
      if (this->state_ == spiff_header) {
        charls::jpeg_stream_writer::write_spiff_directory_entry
                  (&this->writer_,entry_tag,entry_data,entry_data_size_bytes);
        return;
      }
      goto LAB_00105e3c;
    }
  }
  else {
    write_spiff_entry();
LAB_00105e32:
    write_spiff_entry();
  }
  write_spiff_entry();
LAB_00105e3c:
  write_spiff_entry();
}

Assistant:

void write_spiff_entry(const uint32_t entry_tag, CHARLS_IN_READS_BYTES(entry_data_size_bytes) const void* entry_data,
                           const size_t entry_data_size_bytes)
    {
        check_argument(entry_data || entry_data_size_bytes == 0);
        check_argument(entry_tag != spiff_end_of_directory_entry_type);
        check_argument(entry_data_size_bytes <= 65528, jpegls_errc::invalid_argument_size);
        check_operation(state_ == state::spiff_header);

        writer_.write_spiff_directory_entry(entry_tag, entry_data, entry_data_size_bytes);
    }